

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinVWN_RPA>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  double dVar1;
  long lVar2;
  double rho_a;
  double dVar3;
  double e;
  double local_38;
  double local_30;
  
  if (0 < N) {
    lVar2 = 0;
    local_30 = scal_fact;
    do {
      dVar3 = *(double *)((long)rho + lVar2 * 2);
      dVar1 = *(double *)((long)rho + lVar2 * 2 + 8);
      if (dVar3 + dVar1 <= 1e-24) {
        local_38 = 0.0;
      }
      else {
        rho_a = 1e-24;
        if (1e-24 <= dVar3) {
          rho_a = dVar3;
        }
        dVar3 = 1e-24;
        if (1e-24 <= dVar1) {
          dVar3 = dVar1;
        }
        kernel_traits<ExchCXX::BuiltinVWN_RPA>::eval_exc_polar_impl(rho_a,dVar3,&local_38);
        scal_fact = local_30;
      }
      *(double *)((long)eps + lVar2) = local_38 * scal_fact + *(double *)((long)eps + lVar2);
      lVar2 = lVar2 + 8;
    } while ((ulong)(uint)N << 3 != lVar2);
  }
  return;
}

Assistant:

LDA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;

    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], e );
    
    eps[i] += scal_fact * e;

  }

}